

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

int __thiscall
opengv::point_cloud::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  Indices *pIVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  undefined1 auVar6 [16];
  translation_t error;
  point_t transformedPoint;
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  cayley_t cayley;
  transformation_t transformation;
  Matrix<double,_3,_4,_0,_3,_4> *local_1a0;
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *pBStack_198;
  double local_190;
  undefined1 *local_180;
  rotation_t *local_178;
  rotation_t local_168;
  Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> local_120;
  undefined1 local_f0 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_d8 [24];
  Matrix<double,_3,_4,_0,_3,_4> local_c0;
  
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (double)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
       local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       + 9;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       3;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_outerStride = 3;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)x;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr = &local_c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            (&local_120,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_168);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (double)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 3);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            (local_d8,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                       *)&local_168);
  math::cayley2rot(&local_168,(cayley_t *)local_d8);
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startCol.m_value =
       0;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_outerStride = 3;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>,_0>.m_data =
       (PointerType)&local_c0;
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_xpr = &local_c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)&local_120,&local_168);
  local_120.super_BlockImpl<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true,_true>.m_startRow.m_value =
       0x3ff0000000000000;
  lVar3 = 0;
  for (uVar5 = 0; pIVar1 = this->_indices, uVar5 < pIVar1->_numberCorrespondences; uVar5 = uVar5 + 1
      ) {
    iVar4 = (int)uVar5;
    iVar2 = iVar4;
    if (pIVar1->_useIndices != false) {
      iVar2 = *(int *)((long)(pIVar1->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar3 >> 0x1e));
    }
    (*this->_adapter->_vptr_PointCloudAdapterBase[3])
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_1a0,this->_adapter,
               (long)iVar2);
    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 1.97626258336499e-323;
    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)&local_120;
    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = (double)&local_120;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_3,_1,_false> *)&local_168,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_1a0);
    local_1a0 = &local_c0;
    pBStack_198 = &local_120;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_168,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&local_1a0);
    if (this->_indices->_useIndices != false) {
      iVar4 = *(int *)((long)(this->_indices->_indices->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + (lVar3 >> 0x1e));
    }
    (*this->_adapter->_vptr_PointCloudAdapterBase[2])(local_f0,this->_adapter,(long)iVar4);
    local_178 = &local_168;
    local_180 = local_f0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_1a0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_180);
    lVar3 = lVar3 + 0x100000000;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_190 * local_190 +
                   (double)local_1a0 * (double)local_1a0 + (double)pBStack_198 * (double)pBStack_198
    ;
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[uVar5] =
         auVar6._0_8_;
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    transformation_t transformation;
    transformation.col(3) = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    transformation.block<3,3>(0,0) = math::cayley2rot(cayley);

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for( size_t i = 0; i < _indices.size(); i++ )
    {
      p_hom.block<3,1>(0,0) = _adapter.getPoint2(_indices[i]);
      point_t transformedPoint = transformation * p_hom;
      translation_t error = _adapter.getPoint1(_indices[i]) - transformedPoint;
      fvec[i] = error.norm();
    }

    return 0;
  }